

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

XXH128_hash_t
XXH3_len_17to128_128b(xxh_u8 *input,size_t len,xxh_u8 *secret,size_t secretSize,XXH64_hash_t seed)

{
  XXH128_hash_t acc_00;
  XXH128_hash_t acc_01;
  XXH128_hash_t acc_02;
  XXH128_hash_t XVar1;
  XXH64_hash_t XVar2;
  XXH64_hash_t XVar3;
  ulong in_RSI;
  XXH128_hash_t XVar4;
  XXH128_hash_t acc;
  XXH128_hash_t h128;
  undefined8 local_88;
  XXH128_hash_t in_stack_ffffffffffffff88;
  xxh_u8 *in_stack_ffffffffffffff98;
  XXH64_hash_t in_stack_ffffffffffffffa0;
  XXH64_hash_t in_stack_ffffffffffffffa8;
  
  if (0x20 < in_RSI) {
    if (0x40 < in_RSI) {
      if (0x60 < in_RSI) {
        XVar4.high64 = in_stack_ffffffffffffffa8;
        XVar4.low64 = in_stack_ffffffffffffffa0;
        XVar4 = XXH128_mix32B(XVar4,in_stack_ffffffffffffff98,
                              (xxh_u8 *)in_stack_ffffffffffffff88.high64,
                              (xxh_u8 *)in_stack_ffffffffffffff88.low64,local_88);
        in_stack_ffffffffffffffa8 = XVar4.low64;
      }
      acc_00.high64 = in_stack_ffffffffffffffa8;
      acc_00.low64 = in_stack_ffffffffffffffa0;
      XVar4 = XXH128_mix32B(acc_00,in_stack_ffffffffffffff98,
                            (xxh_u8 *)in_stack_ffffffffffffff88.high64,
                            (xxh_u8 *)in_stack_ffffffffffffff88.low64,local_88);
      in_stack_ffffffffffffff98 = (xxh_u8 *)XVar4.low64;
      in_stack_ffffffffffffffa0 = XVar4.high64;
    }
    acc_01.high64 = in_stack_ffffffffffffffa8;
    acc_01.low64 = in_stack_ffffffffffffffa0;
    in_stack_ffffffffffffff88 =
         XXH128_mix32B(acc_01,in_stack_ffffffffffffff98,(xxh_u8 *)in_stack_ffffffffffffff88.high64,
                       (xxh_u8 *)in_stack_ffffffffffffff88.low64,local_88);
  }
  acc_02.high64 = in_stack_ffffffffffffffa8;
  acc_02.low64 = in_stack_ffffffffffffffa0;
  XXH128_mix32B(acc_02,in_stack_ffffffffffffff98,(xxh_u8 *)in_stack_ffffffffffffff88.high64,
                (xxh_u8 *)in_stack_ffffffffffffff88.low64,local_88);
  XVar2 = XXH3_avalanche(0x12b069);
  XVar3 = XXH3_avalanche(0x12b07b);
  XVar1.high64 = -XVar3;
  XVar1.low64 = XVar2;
  return XVar1;
}

Assistant:

XXH_FORCE_INLINE XXH128_hash_t XXH3_len_17to128_128b(
    const xxh_u8* XXH_RESTRICT input, size_t len,
    const xxh_u8* XXH_RESTRICT secret, size_t secretSize, XXH64_hash_t seed) {
  XXH_ASSERT(secretSize >= XXH3_SECRET_SIZE_MIN);
  (void)secretSize;
  XXH_ASSERT(16 < len && len <= 128);

  {
    XXH128_hash_t acc;
    acc.low64 = len * XXH_PRIME64_1;
    acc.high64 = 0;
    if (len > 32) {
      if (len > 64) {
        if (len > 96) {
          acc = XXH128_mix32B(acc, input + 48, input + len - 64, secret + 96,
                              seed);
        }
        acc =
            XXH128_mix32B(acc, input + 32, input + len - 48, secret + 64, seed);
      }
      acc = XXH128_mix32B(acc, input + 16, input + len - 32, secret + 32, seed);
    }
    acc = XXH128_mix32B(acc, input, input + len - 16, secret, seed);
    {
      XXH128_hash_t h128;
      h128.low64 = acc.low64 + acc.high64;
      h128.high64 = (acc.low64 * XXH_PRIME64_1) + (acc.high64 * XXH_PRIME64_4) +
                    ((len - seed) * XXH_PRIME64_2);
      h128.low64 = XXH3_avalanche(h128.low64);
      h128.high64 = (XXH64_hash_t)0 - XXH3_avalanche(h128.high64);
      return h128;
    }
  }
}